

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

bool __thiscall HEkkDual::newDevexFramework(HEkkDual *this,double updated_edge_weight)

{
  double *pdVar1;
  int *piVar2;
  long in_RDI;
  double in_XMM0_Qa;
  bool return_new_devex_framework;
  bool accept_it;
  bool accept_ratio;
  double accept_ratio_threshold;
  HighsInt i_te;
  double devex_ratio;
  double kMaxAllowedDevexWeightRatio;
  double kMinRlvNumberDevexIterations;
  HighsInt kMinAbsNumberDevexIterations;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14 [5];
  
  local_14[0] = 0x19;
  local_20 = 0x3f847ae147ae147b;
  local_28 = 0x4008000000000000;
  local_38 = in_XMM0_Qa / *(double *)(in_RDI + 0x7f0);
  local_40 = *(double *)(in_RDI + 0x7f0) / in_XMM0_Qa;
  pdVar1 = std::max<double>(&local_38,&local_40);
  local_30 = *pdVar1;
  local_44 = (int)((double)*(int *)(in_RDI + 0x18) / 0.01);
  piVar2 = std::max<int>(local_14,&local_44);
  return 9.0 < local_30 || *piVar2 < *(int *)(in_RDI + 4);
}

Assistant:

bool HEkkDual::newDevexFramework(const double updated_edge_weight) {
  // Analyse the Devex weight to determine whether a new framework
  // should be set up
  //
  // There is a new Devex framework if either
  //
  // 1) The weight inaccuracy ratio exceeds kMaxAllowedDevexWeightRatio
  //
  // 2) There have been max(kMinAbsNumberDevexIterations,
  // numRow/kMinRlvNumberDevexIterations) Devex iterations
  //
  const HighsInt kMinAbsNumberDevexIterations = 25;
  const double kMinRlvNumberDevexIterations = 1e-2;
  const double kMaxAllowedDevexWeightRatio = 3.0;

  double devex_ratio = max(updated_edge_weight / computed_edge_weight,
                           computed_edge_weight / updated_edge_weight);
  HighsInt i_te = solver_num_row / kMinRlvNumberDevexIterations;
  i_te = max(kMinAbsNumberDevexIterations, i_te);
  // Square kMaxAllowedDevexWeightRatio due to keeping squared
  // weights
  const double accept_ratio_threshold =
      kMaxAllowedDevexWeightRatio * kMaxAllowedDevexWeightRatio;
  const bool accept_ratio = devex_ratio <= accept_ratio_threshold;
  const bool accept_it = num_devex_iterations <= i_te;
  bool return_new_devex_framework;
  return_new_devex_framework = !accept_ratio || !accept_it;
  return return_new_devex_framework;
}